

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# train_sudoku.cpp
# Opt level: O2

void __thiscall
TrainSudoku::addTrainDependencies
          (TrainSudoku *this,
          set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          *a,set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
             *b)

{
  Field *pFVar1;
  _Base_ptr p_Var2;
  anon_class_8_1_8991fb9c toFieldSet;
  set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_> bFields;
  set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_> aFields;
  anon_class_8_1_8991fb9c local_f0;
  _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
  local_e8;
  _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
  local_b8;
  _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
  local_88;
  _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
  local_58;
  
  local_f0.this = this;
  addTrainDependencies::anon_class_8_1_8991fb9c::operator()
            ((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_> *
             )&local_b8,&local_f0,a);
  addTrainDependencies::anon_class_8_1_8991fb9c::operator()
            ((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_> *
             )&local_e8,&local_f0,b);
  for (p_Var2 = local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &local_b8._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    pFVar1 = *(Field **)(p_Var2 + 1);
    std::
    _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
    ::_Rb_tree(&local_58,&local_e8);
    Field::addGroupDependency
              (pFVar1,(set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                       *)&local_58);
    std::
    _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
    ::~_Rb_tree(&local_58);
  }
  for (p_Var2 = local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &local_e8._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    pFVar1 = *(Field **)(p_Var2 + 1);
    std::
    _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
    ::_Rb_tree(&local_88,&local_b8);
    Field::addGroupDependency
              (pFVar1,(set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                       *)&local_88);
    std::
    _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
    ::~_Rb_tree(&local_88);
  }
  std::
  _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
  ::~_Rb_tree(&local_e8);
  std::
  _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
  ::~_Rb_tree(&local_b8);
  return;
}

Assistant:

void TrainSudoku::addTrainDependencies(
  const std::set<std::pair<int, int>>& a,
  const std::set<std::pair<int, int>>& b)
{
  // Convert coordinate pairs to shared_ptr<Field> for the fields.
  auto toFieldSet = [this](const std::set<std::pair<int, int>>& coords) {
      std::set<std::shared_ptr<Field>, CompareFields> fieldSet;
      for (const auto& coord : coords) {
          fieldSet.insert(fields_[index(coord.first, coord.second)]);
      }
      return fieldSet;
  };

  // Create the field sets for a and b
  auto aFields = toFieldSet(a);
  auto bFields = toFieldSet(b);

  // Add dependencies from a to b
  for (const auto& fieldA : aFields) {
      fieldA->addGroupDependency(bFields);
  }

  // Add dependencies from b to a
  for (const auto& fieldB : bFields) {
      fieldB->addGroupDependency(aFields);
  }
}